

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O0

void __thiscall correctness_xor_signed_Test::TestBody(correctness_xor_signed_Test *this)

{
  undefined1 uVar1;
  undefined1 uVar2;
  AssertionResult gtest_ar_;
  big_integer b;
  big_integer a;
  undefined1 in_stack_fffffffffffffddf;
  undefined6 in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffde6;
  string local_218 [4];
  int in_stack_fffffffffffffdec;
  big_integer *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffdfc;
  big_integer *in_stack_fffffffffffffe00;
  Type in_stack_fffffffffffffe0c;
  AssertHelper *in_stack_fffffffffffffe10;
  char *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  char *in_stack_fffffffffffffe50;
  AssertionResult *in_stack_fffffffffffffe58;
  AssertHelper *in_stack_fffffffffffffe60;
  AssertionResult local_98 [9];
  
  big_integer::big_integer(in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec);
  big_integer::big_integer(in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec);
  big_integer::big_integer
            (in_stack_fffffffffffffe00,
             (big_integer *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  big_integer::big_integer
            (in_stack_fffffffffffffe00,
             (big_integer *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  big_integer::big_integer(in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec);
  ::operator-((big_integer *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
              in_stack_fffffffffffffdf0);
  operator^((big_integer *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
            in_stack_fffffffffffffdf0);
  big_integer::big_integer(in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec);
  uVar1 = operator==((big_integer *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                     in_stack_fffffffffffffdf0);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)
             CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffde6,in_stack_fffffffffffffde0)),
             (bool)in_stack_fffffffffffffddf);
  big_integer::~big_integer
            ((big_integer *)
             CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffde6,in_stack_fffffffffffffde0)));
  big_integer::~big_integer
            ((big_integer *)
             CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffde6,in_stack_fffffffffffffde0)));
  big_integer::~big_integer
            ((big_integer *)
             CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffde6,in_stack_fffffffffffffde0)));
  big_integer::~big_integer
            ((big_integer *)
             CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffde6,in_stack_fffffffffffffde0)));
  big_integer::~big_integer
            ((big_integer *)
             CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffde6,in_stack_fffffffffffffde0)));
  big_integer::~big_integer
            ((big_integer *)
             CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffde6,in_stack_fffffffffffffde0)));
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_98);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe10);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
               in_stack_fffffffffffffe40);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,&in_stack_fffffffffffffe00->sign,
               in_stack_fffffffffffffdfc,&in_stack_fffffffffffffdf0->sign);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffe60,(Message *)in_stack_fffffffffffffe58);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar1,CONCAT16(uVar2,in_stack_fffffffffffffde0)));
    std::__cxx11::string::~string(local_218);
    testing::Message::~Message((Message *)0x11cecc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11cf3b);
  big_integer::~big_integer
            ((big_integer *)CONCAT17(uVar1,CONCAT16(uVar2,in_stack_fffffffffffffde0)));
  big_integer::~big_integer
            ((big_integer *)CONCAT17(uVar1,CONCAT16(uVar2,in_stack_fffffffffffffde0)));
  return;
}

Assistant:

TEST(correctness, xor_signed)
{
    big_integer a = 0xaa;
    big_integer b = 0xcc;

    EXPECT_TRUE((a ^ (b - 256)) == (0x66 - 256));
}